

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::Append4(char *out,AlphaNum *x1,AlphaNum *x2,AlphaNum *x3,AlphaNum *x4)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  AlphaNum *x4_local;
  AlphaNum *x3_local;
  AlphaNum *x2_local;
  AlphaNum *x1_local;
  char *out_local;
  
  pcVar1 = strings::AlphaNum::data(x1);
  sVar2 = strings::AlphaNum::size(x1);
  memcpy(out,pcVar1,sVar2);
  sVar2 = strings::AlphaNum::size(x1);
  pcVar3 = out + sVar2;
  pcVar1 = strings::AlphaNum::data(x2);
  sVar2 = strings::AlphaNum::size(x2);
  memcpy(pcVar3,pcVar1,sVar2);
  sVar2 = strings::AlphaNum::size(x2);
  pcVar3 = pcVar3 + sVar2;
  pcVar1 = strings::AlphaNum::data(x3);
  sVar2 = strings::AlphaNum::size(x3);
  memcpy(pcVar3,pcVar1,sVar2);
  sVar2 = strings::AlphaNum::size(x3);
  pcVar1 = strings::AlphaNum::data(x4);
  sVar4 = strings::AlphaNum::size(x4);
  memcpy(pcVar3 + sVar2,pcVar1,sVar4);
  sVar4 = strings::AlphaNum::size(x4);
  return pcVar3 + sVar2 + sVar4;
}

Assistant:

static char *Append4(char *out,
                     const AlphaNum &x1, const AlphaNum &x2,
                     const AlphaNum &x3, const AlphaNum &x4) {
  memcpy(out, x1.data(), x1.size());
  out += x1.size();

  memcpy(out, x2.data(), x2.size());
  out += x2.size();

  memcpy(out, x3.data(), x3.size());
  out += x3.size();

  memcpy(out, x4.data(), x4.size());
  return out + x4.size();
}